

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tftp.c
# Opt level: O0

CURLcode tftp_perform(connectdata *conn,_Bool *dophase_done)

{
  tftp_state_data_t *state_00;
  CURLcode CVar1;
  tftp_state_data_t *state;
  CURLcode result;
  _Bool *dophase_done_local;
  connectdata *conn_local;
  
  state_00 = (conn->proto).tftpc;
  *dophase_done = false;
  CVar1 = tftp_state_machine(state_00,TFTP_EVENT_INIT);
  if ((state_00->state != TFTP_STATE_FIN) && (CVar1 == CURLE_OK)) {
    tftp_multi_statemach(conn,dophase_done);
  }
  return CVar1;
}

Assistant:

static CURLcode tftp_perform(struct connectdata *conn, bool *dophase_done)
{
  CURLcode              result = CURLE_OK;
  tftp_state_data_t     *state = (tftp_state_data_t *)conn->proto.tftpc;

  *dophase_done = FALSE;

  result = tftp_state_machine(state, TFTP_EVENT_INIT);

  if((state->state == TFTP_STATE_FIN) || result)
    return result;

  tftp_multi_statemach(conn, dophase_done);

  if(*dophase_done)
    DEBUGF(infof(conn->data, "DO phase is complete\n"));

  return result;
}